

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int lyp_check_identifier(ly_ctx *ctx,char *id,LY_IDENT type,lys_module *module,lys_node *parent)

{
  LYS_NODE LVar1;
  lys_submodule *plVar2;
  int iVar3;
  lys_module *plVar4;
  bool bVar5;
  lys_submodule *submod;
  lys_module *mainmod;
  lys_node *node;
  lys_tpdf *tpdf;
  int local_40;
  int size;
  int j;
  int i;
  lys_node *parent_local;
  lys_module *module_local;
  LY_IDENT type_local;
  char *id_local;
  ly_ctx *ctx_local;
  
  if ((ctx == (ly_ctx *)0x0) || (id == (char *)0x0)) {
    __assert_fail("ctx && id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                  ,0x8e7,
                  "int lyp_check_identifier(struct ly_ctx *, const char *, enum LY_IDENT, struct lys_module *, struct lys_node *)"
                 );
  }
  if ((((*id < 'A') || ('Z' < *id)) && ((*id < 'a' || ('z' < *id)))) && (*id != '_')) {
    ly_vlog(ctx,LYE_INID,LY_VLOG_NONE,(void *)0x0,id,"invalid start character");
    return 1;
  }
  for (size = 1; id[size] != '\0'; size = size + 1) {
    if ((((id[size] < 'A') || ('Z' < id[size])) && ((id[size] < 'a' || ('z' < id[size])))) &&
       ((((id[size] < '0' || ('9' < id[size])) && (id[size] != '_')) &&
        ((id[size] != '-' && (id[size] != '.')))))) {
      ly_vlog(ctx,LYE_INID,LY_VLOG_NONE,(void *)0x0,id,"invalid character");
      return 1;
    }
  }
  if (0x40 < size) {
    ly_log(ctx,LY_LLWRN,LY_SUCCESS,"Identifier \"%s\" is long, you should use something shorter.",id
          );
  }
  switch(type) {
  case LY_IDENT_FEATURE:
    if (module == (lys_module *)0x0) {
      __assert_fail("module",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                    ,0x94d,
                    "int lyp_check_identifier(struct ly_ctx *, const char *, enum LY_IDENT, struct lys_module *, struct lys_node *)"
                   );
    }
    plVar4 = lys_main_module(module);
    iVar3 = dup_feature_check(id,module);
    if (iVar3 != 0) {
      ly_vlog(ctx,LYE_DUPID,LY_VLOG_NONE,(void *)0x0,"feature",id);
      return 1;
    }
    size = 0;
    while( true ) {
      bVar5 = false;
      if (size < (int)(uint)plVar4->inc_size) {
        bVar5 = plVar4->inc[size].submodule != (lys_submodule *)0x0;
      }
      if (!bVar5) break;
      iVar3 = dup_feature_check(id,(lys_module *)plVar4->inc[size].submodule);
      if (iVar3 != 0) {
        ly_vlog(ctx,LYE_DUPID,LY_VLOG_NONE,(void *)0x0,"feature",id);
        return 1;
      }
      size = size + 1;
    }
    break;
  default:
    break;
  case LY_IDENT_TYPE:
    if (module == (lys_module *)0x0) {
      __assert_fail("module",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                    ,0x909,
                    "int lyp_check_identifier(struct ly_ctx *, const char *, enum LY_IDENT, struct lys_module *, struct lys_node *)"
                   );
    }
    plVar4 = lys_main_module(module);
    iVar3 = strcmp(id,"binary");
    if (((((iVar3 == 0) || (iVar3 = strcmp(id,"bits"), iVar3 == 0)) ||
         ((iVar3 = strcmp(id,"boolean"), iVar3 == 0 ||
          ((((iVar3 = strcmp(id,"decimal64"), iVar3 == 0 || (iVar3 = strcmp(id,"empty"), iVar3 == 0)
             ) || (iVar3 = strcmp(id,"enumeration"), iVar3 == 0)) ||
           ((iVar3 = strcmp(id,"identityref"), iVar3 == 0 ||
            (iVar3 = strcmp(id,"instance-identifier"), iVar3 == 0)))))))) ||
        (iVar3 = strcmp(id,"int8"), iVar3 == 0)) ||
       ((((iVar3 = strcmp(id,"int16"), iVar3 == 0 || (iVar3 = strcmp(id,"int32"), iVar3 == 0)) ||
         (((iVar3 = strcmp(id,"int64"), iVar3 == 0 ||
           (((iVar3 = strcmp(id,"leafref"), iVar3 == 0 || (iVar3 = strcmp(id,"string"), iVar3 == 0))
            || (iVar3 = strcmp(id,"uint8"), iVar3 == 0)))) ||
          (((iVar3 = strcmp(id,"uint16"), iVar3 == 0 || (iVar3 = strcmp(id,"uint32"), iVar3 == 0))
           || (iVar3 = strcmp(id,"uint64"), iVar3 == 0)))))) ||
        (iVar3 = strcmp(id,"union"), _j = parent, iVar3 == 0)))) {
      ly_vlog(ctx,LYE_INARG,LY_VLOG_NONE,(void *)0x0,id,"typedef");
      ly_vlog(ctx,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Typedef name duplicates a built-in type.");
      return 1;
    }
    for (; _j != (lys_node *)0x0; _j = lys_parent(_j)) {
      LVar1 = _j->nodetype;
      if (LVar1 == LYS_CONTAINER) {
        tpdf._4_4_ = (uint)*(ushort *)(_j->padding + 2);
        node = (lys_node *)_j[1].ref;
LAB_00137458:
        iVar3 = dup_typedef_check(id,(lys_tpdf *)node,tpdf._4_4_);
        if (iVar3 != 0) {
          ly_vlog(ctx,LYE_DUPID,LY_VLOG_NONE,(void *)0x0,"typedef",id);
          return 1;
        }
      }
      else {
        if (LVar1 == LYS_LIST) {
          tpdf._4_4_ = (uint)_j->padding[1];
          node = (lys_node *)_j[1].ref;
          goto LAB_00137458;
        }
        if (LVar1 == LYS_GROUPING) {
          tpdf._4_4_ = (uint)*(ushort *)(_j->padding + 2);
          node = *(lys_node **)_j->hash;
          goto LAB_00137458;
        }
      }
    }
    iVar3 = dup_typedef_check(id,module->tpdf,(uint)module->tpdf_size);
    if (iVar3 != 0) {
      ly_vlog(ctx,LYE_DUPID,LY_VLOG_NONE,(void *)0x0,"typedef",id);
      return 1;
    }
    size = 0;
    while( true ) {
      bVar5 = false;
      if (size < (int)(uint)plVar4->inc_size) {
        bVar5 = plVar4->inc[size].submodule != (lys_submodule *)0x0;
      }
      if (!bVar5) break;
      iVar3 = dup_typedef_check(id,(plVar4->inc[size].submodule)->tpdf,
                                (uint)(plVar4->inc[size].submodule)->tpdf_size);
      if (iVar3 != 0) {
        ly_vlog(ctx,LYE_DUPID,LY_VLOG_NONE,(void *)0x0,"typedef",id);
        return 1;
      }
      size = size + 1;
    }
    break;
  case LY_IDENT_NAME:
    if (parent != (lys_node *)0x0) {
      for (mainmod = (lys_module *)parent->child; mainmod != (lys_module *)0x0;
          mainmod = *(lys_module **)&mainmod->ext_size) {
        if (mainmod->ctx == (ly_ctx *)id) {
          ly_vlog(ctx,LYE_INID,LY_VLOG_NONE,(void *)0x0,id,"name duplication");
          return 1;
        }
      }
    }
    break;
  case LY_IDENT_PREFIX:
    if (module == (lys_module *)0x0) {
      __assert_fail("module",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                    ,0x944,
                    "int lyp_check_identifier(struct ly_ctx *, const char *, enum LY_IDENT, struct lys_module *, struct lys_node *)"
                   );
    }
    iVar3 = dup_prefix_check(id,module);
    if (iVar3 != 0) {
      ly_vlog(ctx,LYE_DUPID,LY_VLOG_NONE,(void *)0x0,"prefix",id);
      return 1;
    }
    break;
  case LY_IDENT_EXTENSION:
    if (module == (lys_module *)0x0) {
      __assert_fail("module",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                    ,0x961,
                    "int lyp_check_identifier(struct ly_ctx *, const char *, enum LY_IDENT, struct lys_module *, struct lys_node *)"
                   );
    }
    plVar4 = lys_main_module(module);
    for (size = 0; size < (int)(uint)plVar4->extensions_size; size = size + 1) {
      if (id == plVar4->extensions[size].name) {
        ly_vlog(ctx,LYE_DUPID,LY_VLOG_NONE,(void *)0x0,"extension",id);
        return 1;
      }
    }
    local_40 = 0;
    while( true ) {
      bVar5 = false;
      if (local_40 < (int)(uint)plVar4->inc_size) {
        bVar5 = plVar4->inc[local_40].submodule != (lys_submodule *)0x0;
      }
      if (!bVar5) break;
      plVar2 = plVar4->inc[local_40].submodule;
      for (size = 0; size < (int)(uint)plVar2->extensions_size; size = size + 1) {
        if (id == plVar2->extensions[size].name) {
          ly_vlog(ctx,LYE_DUPID,LY_VLOG_NONE,(void *)0x0,"extension",id);
          return 1;
        }
      }
      local_40 = local_40 + 1;
    }
  }
  return 0;
}

Assistant:

int
lyp_check_identifier(struct ly_ctx *ctx, const char *id, enum LY_IDENT type, struct lys_module *module,
                     struct lys_node *parent)
{
    int i, j;
    int size;
    struct lys_tpdf *tpdf;
    struct lys_node *node;
    struct lys_module *mainmod;
    struct lys_submodule *submod;

    assert(ctx && id);

    /* check id syntax */
    if (!(id[0] >= 'A' && id[0] <= 'Z') && !(id[0] >= 'a' && id[0] <= 'z') && id[0] != '_') {
        LOGVAL(ctx, LYE_INID, LY_VLOG_NONE, NULL, id, "invalid start character");
        return EXIT_FAILURE;
    }
    for (i = 1; id[i]; i++) {
        if (!(id[i] >= 'A' && id[i] <= 'Z') && !(id[i] >= 'a' && id[i] <= 'z')
                && !(id[i] >= '0' && id[i] <= '9') && id[i] != '_' && id[i] != '-' && id[i] != '.') {
            LOGVAL(ctx, LYE_INID, LY_VLOG_NONE, NULL, id, "invalid character");
            return EXIT_FAILURE;
        }
    }

    if (i > 64) {
        LOGWRN(ctx, "Identifier \"%s\" is long, you should use something shorter.", id);
    }

    switch (type) {
    case LY_IDENT_NAME:
        /* check uniqueness of the node within its siblings */
        if (!parent) {
            break;
        }

        LY_TREE_FOR(parent->child, node) {
            if (ly_strequal(node->name, id, 1)) {
                LOGVAL(ctx, LYE_INID, LY_VLOG_NONE, NULL, id, "name duplication");
                return EXIT_FAILURE;
            }
        }
        break;
    case LY_IDENT_TYPE:
        assert(module);
        mainmod = lys_main_module(module);

        /* check collision with the built-in types */
        if (!strcmp(id, "binary") || !strcmp(id, "bits") ||
                !strcmp(id, "boolean") || !strcmp(id, "decimal64") ||
                !strcmp(id, "empty") || !strcmp(id, "enumeration") ||
                !strcmp(id, "identityref") || !strcmp(id, "instance-identifier") ||
                !strcmp(id, "int8") || !strcmp(id, "int16") ||
                !strcmp(id, "int32") || !strcmp(id, "int64") ||
                !strcmp(id, "leafref") || !strcmp(id, "string") ||
                !strcmp(id, "uint8") || !strcmp(id, "uint16") ||
                !strcmp(id, "uint32") || !strcmp(id, "uint64") || !strcmp(id, "union")) {
            LOGVAL(ctx, LYE_INARG, LY_VLOG_NONE, NULL, id, "typedef");
            LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Typedef name duplicates a built-in type.");
            return EXIT_FAILURE;
        }

        /* check locally scoped typedefs (avoid name shadowing) */
        for (; parent; parent = lys_parent(parent)) {
            switch (parent->nodetype) {
            case LYS_CONTAINER:
                size = ((struct lys_node_container *)parent)->tpdf_size;
                tpdf = ((struct lys_node_container *)parent)->tpdf;
                break;
            case LYS_LIST:
                size = ((struct lys_node_list *)parent)->tpdf_size;
                tpdf = ((struct lys_node_list *)parent)->tpdf;
                break;
            case LYS_GROUPING:
                size = ((struct lys_node_grp *)parent)->tpdf_size;
                tpdf = ((struct lys_node_grp *)parent)->tpdf;
                break;
            default:
                continue;
            }

            if (dup_typedef_check(id, tpdf, size)) {
                LOGVAL(ctx, LYE_DUPID, LY_VLOG_NONE, NULL, "typedef", id);
                return EXIT_FAILURE;
            }
        }

        /* check top-level names */
        if (dup_typedef_check(id, module->tpdf, module->tpdf_size)) {
            LOGVAL(ctx, LYE_DUPID, LY_VLOG_NONE, NULL, "typedef", id);
            return EXIT_FAILURE;
        }

        /* check submodule's top-level names */
        for (i = 0; i < mainmod->inc_size && mainmod->inc[i].submodule; i++) {
            if (dup_typedef_check(id, mainmod->inc[i].submodule->tpdf, mainmod->inc[i].submodule->tpdf_size)) {
                LOGVAL(ctx, LYE_DUPID, LY_VLOG_NONE, NULL, "typedef", id);
                return EXIT_FAILURE;
            }
        }

        break;
    case LY_IDENT_PREFIX:
        assert(module);

        /* check the module itself */
        if (dup_prefix_check(id, module)) {
            LOGVAL(ctx, LYE_DUPID, LY_VLOG_NONE, NULL, "prefix", id);
            return EXIT_FAILURE;
        }
        break;
    case LY_IDENT_FEATURE:
        assert(module);
        mainmod = lys_main_module(module);

        /* check feature name uniqueness*/
        /* check features in the current module */
        if (dup_feature_check(id, module)) {
            LOGVAL(ctx, LYE_DUPID, LY_VLOG_NONE, NULL, "feature", id);
            return EXIT_FAILURE;
        }

        /* and all its submodules */
        for (i = 0; i < mainmod->inc_size && mainmod->inc[i].submodule; i++) {
            if (dup_feature_check(id, (struct lys_module *)mainmod->inc[i].submodule)) {
                LOGVAL(ctx, LYE_DUPID, LY_VLOG_NONE, NULL, "feature", id);
                return EXIT_FAILURE;
            }
        }
        break;

    case LY_IDENT_EXTENSION:
        assert(module);
        mainmod = lys_main_module(module);

        /* check extension name uniqueness in the main module ... */
        for (i = 0; i < mainmod->extensions_size; i++) {
            if (ly_strequal(id, mainmod->extensions[i].name, 1)) {
                LOGVAL(ctx, LYE_DUPID, LY_VLOG_NONE, NULL, "extension", id);
                return EXIT_FAILURE;
            }
        }

        /* ... and all its submodules */
        for (j = 0; j < mainmod->inc_size && mainmod->inc[j].submodule; j++) {
            submod = mainmod->inc[j].submodule; /* shortcut */
            for (i = 0; i < submod->extensions_size; i++) {
                if (ly_strequal(id, submod->extensions[i].name, 1)) {
                    LOGVAL(ctx, LYE_DUPID, LY_VLOG_NONE, NULL, "extension", id);
                    return EXIT_FAILURE;
                }
            }
        }

        break;

    default:
        /* no check required */
        break;
    }

    return EXIT_SUCCESS;
}